

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  void *pvVar3;
  FailureReporterInterface *pFVar4;
  long *plVar5;
  char *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  bool bVar6;
  Expectation EVar7;
  long *local_30 [2];
  long local_20 [2];
  
  plVar5 = *(long **)((long)&(exp->source_text_).field_2 + 8);
  plVar1 = (long *)(exp->description_)._M_dataplus._M_p;
  bVar6 = plVar5 == plVar1;
  if (!bVar6) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
    while (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX) {
      plVar5 = plVar5 + 2;
      bVar6 = plVar5 == plVar1;
      if (bVar6) goto LAB_00144c3f;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar5;
    }
    this->_vptr_UntypedFunctionMockerBase = (_func_int **)p_Var2;
    pvVar3 = (void *)plVar5[1];
    this->mock_obj_ = pvVar3;
    if (pvVar3 != (void *)0x0) {
      in_RDX = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)pvVar3 + 8) = *(int *)((long)pvVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)pvVar3 + 8) = *(int *)((long)pvVar3 + 8) + 1;
      }
    }
    if (!bVar6) goto LAB_00144ca2;
  }
LAB_00144c3f:
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Cannot find expectation.","");
  pFVar4 = GetFailureReporter();
  (*pFVar4->_vptr_FailureReporterInterface[2])
            (pFVar4,1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O1/googletest-src/googlemock/src/gmock-spec-builders.cc"
             ,0x182,local_30);
  in_RDX = (char *)extraout_RDX;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
    in_RDX = (char *)extraout_RDX_00;
  }
  this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  this->mock_obj_ = (void *)0x0;
LAB_00144ca2:
  EVar7.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  EVar7.expectation_base_.
  super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Expectation)
         EVar7.expectation_base_.
         super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it = untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}